

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O2

void __thiscall
TPZDohrAssembly<std::complex<double>_>::Write
          (TPZDohrAssembly<std::complex<double>_> *this,TPZStream *buf,int withclassid)

{
  undefined4 in_EAX;
  int f;
  long lVar1;
  long lVar2;
  int ncoarse;
  int nfine;
  
  _ncoarse = CONCAT44((int)(this->fFineEqs).fNElements,in_EAX);
  (*buf->_vptr_TPZStream[3])(buf,&nfine,1);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < nfine; lVar1 = lVar1 + 1) {
    TPZStream::Write<int>
              (buf,(TPZVec<int> *)((long)&((this->fFineEqs).fStore)->_vptr_TPZVec + lVar2));
    lVar2 = lVar2 + 0x20;
  }
  _ncoarse = CONCAT44(nfine,(int)(this->fCoarseEqs).fNElements);
  (*buf->_vptr_TPZStream[3])(buf,&ncoarse,1);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < ncoarse; lVar1 = lVar1 + 1) {
    TPZStream::Write<int>
              (buf,(TPZVec<int> *)((long)&((this->fCoarseEqs).fStore)->_vptr_TPZVec + lVar2));
    lVar2 = lVar2 + 0x20;
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::Write(TPZStream &buf, int withclassid) const
{
    int nfine = fFineEqs.size();
    buf.Write(&nfine,1);
    for (int f=0; f<nfine; f++) {
        buf.Write( fFineEqs[f]);
    }
    int ncoarse = fCoarseEqs.size();
    buf.Write(&ncoarse,1);
    for (int nc=0; nc<ncoarse; nc++) {
        buf.Write( fCoarseEqs[nc]);
    }
}